

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *pGVar8;
  undefined1 auVar9 [32];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  undefined4 uVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  RayHitK<8> *pRVar28;
  long lVar29;
  Scene *pSVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  long lVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  undefined1 (*pauVar38) [16];
  ulong unaff_R12;
  size_t mask;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2859;
  ulong local_2858;
  ulong local_2850;
  RayHitK<8> *local_2848;
  Scene *local_2840;
  undefined8 uStack_2838;
  undefined1 local_2830 [16];
  undefined8 local_2820;
  float fStack_2818;
  float fStack_2814;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  ulong local_27d8;
  undefined1 local_27d0 [16];
  ulong local_27c0;
  ulong local_27b8;
  ulong local_27b0;
  ulong local_27a8;
  undefined8 *local_27a0;
  void *local_2798;
  RTCRayQueryContext *local_2790;
  RayHitK<8> *local_2788;
  undefined1 (*local_2780) [32];
  undefined4 local_2778;
  float local_2770;
  float fStack_276c;
  float fStack_2768;
  float fStack_2764;
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 *local_2740;
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [32];
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar27;
  
  pauVar38 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar25 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_24e0._4_4_ = uVar25;
  local_24e0._0_4_ = uVar25;
  local_24e0._8_4_ = uVar25;
  local_24e0._12_4_ = uVar25;
  local_24e0._16_4_ = uVar25;
  local_24e0._20_4_ = uVar25;
  local_24e0._24_4_ = uVar25;
  local_24e0._28_4_ = uVar25;
  auVar89 = ZEXT3264(local_24e0);
  uVar25 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = uVar25;
  local_2500._0_4_ = uVar25;
  local_2500._8_4_ = uVar25;
  local_2500._12_4_ = uVar25;
  local_2500._16_4_ = uVar25;
  local_2500._20_4_ = uVar25;
  local_2500._24_4_ = uVar25;
  local_2500._28_4_ = uVar25;
  auVar95 = ZEXT3264(local_2500);
  uVar25 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_2520._4_4_ = uVar25;
  local_2520._0_4_ = uVar25;
  local_2520._8_4_ = uVar25;
  local_2520._12_4_ = uVar25;
  local_2520._16_4_ = uVar25;
  local_2520._20_4_ = uVar25;
  local_2520._24_4_ = uVar25;
  local_2520._28_4_ = uVar25;
  auVar98 = ZEXT3264(local_2520);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar18 = fVar1 * 0.99999964;
  local_2540._4_4_ = fVar18;
  local_2540._0_4_ = fVar18;
  local_2540._8_4_ = fVar18;
  local_2540._12_4_ = fVar18;
  local_2540._16_4_ = fVar18;
  local_2540._20_4_ = fVar18;
  local_2540._24_4_ = fVar18;
  local_2540._28_4_ = fVar18;
  auVar99 = ZEXT3264(local_2540);
  fVar18 = fVar2 * 0.99999964;
  local_2560._4_4_ = fVar18;
  local_2560._0_4_ = fVar18;
  local_2560._8_4_ = fVar18;
  local_2560._12_4_ = fVar18;
  local_2560._16_4_ = fVar18;
  local_2560._20_4_ = fVar18;
  local_2560._24_4_ = fVar18;
  local_2560._28_4_ = fVar18;
  auVar102 = ZEXT3264(local_2560);
  fVar18 = fVar3 * 0.99999964;
  local_2580._4_4_ = fVar18;
  local_2580._0_4_ = fVar18;
  local_2580._8_4_ = fVar18;
  local_2580._12_4_ = fVar18;
  local_2580._16_4_ = fVar18;
  local_2580._20_4_ = fVar18;
  local_2580._24_4_ = fVar18;
  local_2580._28_4_ = fVar18;
  auVar104 = ZEXT3264(local_2580);
  fVar1 = fVar1 * 1.0000004;
  local_25a0._4_4_ = fVar1;
  local_25a0._0_4_ = fVar1;
  local_25a0._8_4_ = fVar1;
  local_25a0._12_4_ = fVar1;
  local_25a0._16_4_ = fVar1;
  local_25a0._20_4_ = fVar1;
  local_25a0._24_4_ = fVar1;
  local_25a0._28_4_ = fVar1;
  auVar105 = ZEXT3264(local_25a0);
  fVar2 = fVar2 * 1.0000004;
  local_25c0._4_4_ = fVar2;
  local_25c0._0_4_ = fVar2;
  local_25c0._8_4_ = fVar2;
  local_25c0._12_4_ = fVar2;
  local_25c0._16_4_ = fVar2;
  local_25c0._20_4_ = fVar2;
  local_25c0._24_4_ = fVar2;
  local_25c0._28_4_ = fVar2;
  auVar109 = ZEXT3264(local_25c0);
  fVar3 = fVar3 * 1.0000004;
  local_25e0._4_4_ = fVar3;
  local_25e0._0_4_ = fVar3;
  local_25e0._8_4_ = fVar3;
  local_25e0._12_4_ = fVar3;
  local_25e0._16_4_ = fVar3;
  local_25e0._20_4_ = fVar3;
  local_25e0._24_4_ = fVar3;
  local_25e0._28_4_ = fVar3;
  auVar114 = ZEXT3264(local_25e0);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_27b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_27c0 = uVar31 ^ 0x20;
  local_27a8 = uVar36 ^ 0x20;
  local_27b0 = local_27b8 ^ 0x20;
  iVar24 = (tray->tnear).field_0.i[k];
  local_26c0._4_4_ = iVar24;
  local_26c0._0_4_ = iVar24;
  local_26c0._8_4_ = iVar24;
  local_26c0._12_4_ = iVar24;
  local_26c0._16_4_ = iVar24;
  local_26c0._20_4_ = iVar24;
  local_26c0._24_4_ = iVar24;
  local_26c0._28_4_ = iVar24;
  auVar115 = ZEXT3264(local_26c0);
  iVar24 = (tray->tfar).field_0.i[k];
  auVar49 = ZEXT3264(CONCAT428(iVar24,CONCAT424(iVar24,CONCAT420(iVar24,CONCAT416(iVar24,CONCAT412(
                                                  iVar24,CONCAT48(iVar24,CONCAT44(iVar24,iVar24)))))
                                               )));
  iVar24 = 1 << ((uint)k & 0x1f);
  auVar55._4_4_ = iVar24;
  auVar55._0_4_ = iVar24;
  auVar55._8_4_ = iVar24;
  auVar55._12_4_ = iVar24;
  auVar55._16_4_ = iVar24;
  auVar55._20_4_ = iVar24;
  auVar55._24_4_ = iVar24;
  auVar55._28_4_ = iVar24;
  auVar94 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar55 = vpand_avx2(auVar55,auVar94);
  local_2600 = vpcmpeqd_avx2(auVar55,auVar94);
  uVar27 = local_27b8;
  uVar41 = local_27c0;
  local_2858 = uVar36;
  local_2850 = uVar31;
  local_2848 = ray;
  do {
    do {
      do {
        if (pauVar38 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar37 = pauVar38 + -1;
        pauVar38 = pauVar38 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar37 + 8));
      uVar40 = *(ulong *)*pauVar38;
      do {
        auVar97 = auVar98._0_32_;
        auVar94 = auVar95._0_32_;
        auVar55 = auVar89._0_32_;
        if ((uVar40 & 8) == 0) {
          uVar26 = uVar40 & 0xfffffffffffffff0;
          uVar25 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar56._4_4_ = uVar25;
          auVar56._0_4_ = uVar25;
          auVar56._8_4_ = uVar25;
          auVar56._12_4_ = uVar25;
          auVar56._16_4_ = uVar25;
          auVar56._20_4_ = uVar25;
          auVar56._24_4_ = uVar25;
          auVar56._28_4_ = uVar25;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar31),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar31));
          auVar57 = vsubps_avx(ZEXT1632(auVar50),auVar55);
          auVar19._4_4_ = auVar99._4_4_ * auVar57._4_4_;
          auVar19._0_4_ = auVar99._0_4_ * auVar57._0_4_;
          auVar19._8_4_ = auVar99._8_4_ * auVar57._8_4_;
          auVar19._12_4_ = auVar99._12_4_ * auVar57._12_4_;
          auVar19._16_4_ = auVar99._16_4_ * auVar57._16_4_;
          auVar19._20_4_ = auVar99._20_4_ * auVar57._20_4_;
          auVar19._24_4_ = auVar99._24_4_ * auVar57._24_4_;
          auVar19._28_4_ = auVar57._28_4_;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar36),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar36));
          auVar57 = vmaxps_avx(auVar115._0_32_,auVar19);
          auVar19 = vsubps_avx(ZEXT1632(auVar50),auVar94);
          auVar9._4_4_ = auVar102._4_4_ * auVar19._4_4_;
          auVar9._0_4_ = auVar102._0_4_ * auVar19._0_4_;
          auVar9._8_4_ = auVar102._8_4_ * auVar19._8_4_;
          auVar9._12_4_ = auVar102._12_4_ * auVar19._12_4_;
          auVar9._16_4_ = auVar102._16_4_ * auVar19._16_4_;
          auVar9._20_4_ = auVar102._20_4_ * auVar19._20_4_;
          auVar9._24_4_ = auVar102._24_4_ * auVar19._24_4_;
          auVar9._28_4_ = auVar19._28_4_;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar27),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar27));
          auVar19 = vsubps_avx(ZEXT1632(auVar50),auVar97);
          auVar20._4_4_ = auVar104._4_4_ * auVar19._4_4_;
          auVar20._0_4_ = auVar104._0_4_ * auVar19._0_4_;
          auVar20._8_4_ = auVar104._8_4_ * auVar19._8_4_;
          auVar20._12_4_ = auVar104._12_4_ * auVar19._12_4_;
          auVar20._16_4_ = auVar104._16_4_ * auVar19._16_4_;
          auVar20._20_4_ = auVar104._20_4_ * auVar19._20_4_;
          auVar20._24_4_ = auVar104._24_4_ * auVar19._24_4_;
          auVar20._28_4_ = auVar19._28_4_;
          auVar19 = vmaxps_avx(auVar9,auVar20);
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + uVar41),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + uVar41));
          local_24c0 = vmaxps_avx(auVar57,auVar19);
          auVar57 = vsubps_avx(ZEXT1632(auVar50),auVar55);
          auVar21._4_4_ = auVar105._4_4_ * auVar57._4_4_;
          auVar21._0_4_ = auVar105._0_4_ * auVar57._0_4_;
          auVar21._8_4_ = auVar105._8_4_ * auVar57._8_4_;
          auVar21._12_4_ = auVar105._12_4_ * auVar57._12_4_;
          auVar21._16_4_ = auVar105._16_4_ * auVar57._16_4_;
          auVar21._20_4_ = auVar105._20_4_ * auVar57._20_4_;
          auVar21._24_4_ = auVar105._24_4_ * auVar57._24_4_;
          auVar21._28_4_ = auVar57._28_4_;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + local_27a8),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + local_27a8));
          auVar57 = vsubps_avx(ZEXT1632(auVar50),auVar94);
          auVar22._4_4_ = auVar109._4_4_ * auVar57._4_4_;
          auVar22._0_4_ = auVar109._0_4_ * auVar57._0_4_;
          auVar22._8_4_ = auVar109._8_4_ * auVar57._8_4_;
          auVar22._12_4_ = auVar109._12_4_ * auVar57._12_4_;
          auVar22._16_4_ = auVar109._16_4_ * auVar57._16_4_;
          auVar22._20_4_ = auVar109._20_4_ * auVar57._20_4_;
          auVar22._24_4_ = auVar109._24_4_ * auVar57._24_4_;
          auVar22._28_4_ = auVar57._28_4_;
          auVar50 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar26 + 0x100 + local_27b0),auVar56,
                                    *(undefined1 (*) [32])(uVar26 + 0x40 + local_27b0));
          auVar57 = vsubps_avx(ZEXT1632(auVar50),auVar97);
          auVar23._4_4_ = auVar114._4_4_ * auVar57._4_4_;
          auVar23._0_4_ = auVar114._0_4_ * auVar57._0_4_;
          auVar23._8_4_ = auVar114._8_4_ * auVar57._8_4_;
          auVar23._12_4_ = auVar114._12_4_ * auVar57._12_4_;
          auVar23._16_4_ = auVar114._16_4_ * auVar57._16_4_;
          auVar23._20_4_ = auVar114._20_4_ * auVar57._20_4_;
          auVar23._24_4_ = auVar114._24_4_ * auVar57._24_4_;
          auVar23._28_4_ = auVar57._28_4_;
          auVar57 = vminps_avx(auVar22,auVar23);
          auVar19 = vminps_avx(auVar49._0_32_,auVar21);
          auVar57 = vminps_avx(auVar19,auVar57);
          auVar57 = vcmpps_avx(local_24c0,auVar57,2);
          if (((uint)uVar40 & 7) == 6) {
            auVar19 = vcmpps_avx(*(undefined1 (*) [32])(uVar26 + 0x1c0),auVar56,2);
            auVar9 = vcmpps_avx(auVar56,*(undefined1 (*) [32])(uVar26 + 0x1e0),1);
            auVar19 = vandps_avx(auVar19,auVar9);
            auVar57 = vandps_avx(auVar19,auVar57);
            auVar50 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
          }
          else {
            auVar50 = vpackssdw_avx(auVar57._0_16_,auVar57._16_16_);
          }
          auVar50 = vpsllw_avx(auVar50,0xf);
          auVar50 = vpacksswb_avx(auVar50,auVar50);
          unaff_R12 = (ulong)(byte)(SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar50 >> 0x3f,0) << 7);
        }
        if ((uVar40 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar24 = 4;
          }
          else {
            uVar26 = uVar40 & 0xfffffffffffffff0;
            lVar29 = 0;
            for (uVar40 = unaff_R12; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            iVar24 = 0;
            uVar33 = unaff_R12 - 1 & unaff_R12;
            uVar40 = *(ulong *)(uVar26 + lVar29 * 8);
            if (uVar33 != 0) {
              uVar6 = *(uint *)(local_24c0 + lVar29 * 4);
              lVar29 = 0;
              for (uVar31 = uVar33; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar7 = *(ulong *)(uVar26 + lVar29 * 8);
              uVar5 = *(uint *)(local_24c0 + lVar29 * 4);
              uVar31 = local_2850;
              uVar36 = local_2858;
              if (uVar33 == 0) {
                if (uVar6 < uVar5) {
                  *(ulong *)*pauVar38 = uVar7;
                  *(uint *)(*pauVar38 + 8) = uVar5;
                  pauVar38 = pauVar38 + 1;
                }
                else {
                  *(ulong *)*pauVar38 = uVar40;
                  *(uint *)(*pauVar38 + 8) = uVar6;
                  pauVar38 = pauVar38 + 1;
                  uVar40 = uVar7;
                }
              }
              else {
                auVar50._8_8_ = 0;
                auVar50._0_8_ = uVar40;
                auVar50 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar6));
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar7;
                auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar5));
                lVar29 = 0;
                for (uVar40 = uVar33; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  lVar29 = lVar29 + 1;
                }
                uVar33 = uVar33 - 1 & uVar33;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = *(ulong *)(uVar26 + lVar29 * 8);
                auVar51 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_24c0 + lVar29 * 4)));
                auVar65 = vpcmpgtd_avx(auVar58,auVar50);
                if (uVar33 == 0) {
                  auVar79 = vpshufd_avx(auVar65,0xaa);
                  auVar65 = vblendvps_avx(auVar58,auVar50,auVar79);
                  auVar50 = vblendvps_avx(auVar50,auVar58,auVar79);
                  auVar58 = vpcmpgtd_avx(auVar51,auVar65);
                  auVar79 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar51,auVar65,auVar79);
                  auVar65 = vblendvps_avx(auVar65,auVar51,auVar79);
                  auVar51 = vpcmpgtd_avx(auVar65,auVar50);
                  auVar79 = vpshufd_avx(auVar51,0xaa);
                  auVar51 = vblendvps_avx(auVar65,auVar50,auVar79);
                  auVar50 = vblendvps_avx(auVar50,auVar65,auVar79);
                  *pauVar38 = auVar50;
                  pauVar38[1] = auVar51;
                  uVar40 = auVar58._0_8_;
                  pauVar38 = pauVar38 + 2;
                }
                else {
                  lVar29 = 0;
                  for (uVar40 = uVar33; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000
                      ) {
                    lVar29 = lVar29 + 1;
                  }
                  uVar33 = uVar33 - 1 & uVar33;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = *(ulong *)(uVar26 + lVar29 * 8);
                  auVar79 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_24c0 + lVar29 * 4)));
                  if (uVar33 == 0) {
                    auVar68 = vpshufd_avx(auVar65,0xaa);
                    auVar65 = vblendvps_avx(auVar58,auVar50,auVar68);
                    auVar50 = vblendvps_avx(auVar50,auVar58,auVar68);
                    auVar58 = vpcmpgtd_avx(auVar79,auVar51);
                    auVar68 = vpshufd_avx(auVar58,0xaa);
                    auVar58 = vblendvps_avx(auVar79,auVar51,auVar68);
                    auVar51 = vblendvps_avx(auVar51,auVar79,auVar68);
                    auVar79 = vpcmpgtd_avx(auVar51,auVar50);
                    auVar68 = vpshufd_avx(auVar79,0xaa);
                    auVar79 = vblendvps_avx(auVar51,auVar50,auVar68);
                    auVar50 = vblendvps_avx(auVar50,auVar51,auVar68);
                    auVar51 = vpcmpgtd_avx(auVar58,auVar65);
                    auVar68 = vpshufd_avx(auVar51,0xaa);
                    auVar51 = vblendvps_avx(auVar58,auVar65,auVar68);
                    auVar58 = vblendvps_avx(auVar65,auVar58,auVar68);
                    auVar65 = vpcmpgtd_avx(auVar79,auVar58);
                    auVar68 = vpshufd_avx(auVar65,0xaa);
                    auVar65 = vblendvps_avx(auVar79,auVar58,auVar68);
                    auVar58 = vblendvps_avx(auVar58,auVar79,auVar68);
                    *pauVar38 = auVar50;
                    pauVar38[1] = auVar58;
                    pauVar38[2] = auVar65;
                    uVar40 = auVar51._0_8_;
                    pauVar37 = pauVar38 + 3;
                  }
                  else {
                    *pauVar38 = auVar50;
                    pauVar38[1] = auVar58;
                    pauVar38[2] = auVar51;
                    pauVar38[3] = auVar79;
                    lVar29 = 0x30;
                    do {
                      lVar35 = lVar29;
                      lVar29 = 0;
                      for (uVar40 = uVar33; (uVar40 & 1) == 0;
                          uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                        lVar29 = lVar29 + 1;
                      }
                      auVar51._8_8_ = 0;
                      auVar51._0_8_ = *(ulong *)(uVar26 + lVar29 * 8);
                      auVar50 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_24c0 + lVar29 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar38[1] + lVar35) = auVar50;
                      uVar33 = uVar33 - 1 & uVar33;
                      lVar29 = lVar35 + 0x10;
                    } while (uVar33 != 0);
                    pauVar37 = (undefined1 (*) [16])(pauVar38[1] + lVar35);
                    if (lVar35 + 0x10 != 0) {
                      lVar29 = 0x10;
                      pauVar32 = pauVar38;
                      do {
                        auVar50 = pauVar32[1];
                        uVar6 = *(uint *)(pauVar32[1] + 8);
                        pauVar32 = pauVar32 + 1;
                        lVar35 = lVar29;
                        do {
                          if (uVar6 <= *(uint *)(pauVar38[-1] + lVar35 + 8)) {
                            pauVar34 = (undefined1 (*) [16])(*pauVar38 + lVar35);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar38 + lVar35) =
                               *(undefined1 (*) [16])(pauVar38[-1] + lVar35);
                          lVar35 = lVar35 + -0x10;
                          pauVar34 = pauVar38;
                        } while (lVar35 != 0);
                        *pauVar34 = auVar50;
                        lVar29 = lVar29 + 0x10;
                      } while (pauVar37 != pauVar32);
                    }
                    uVar40 = *(ulong *)*pauVar37;
                  }
                  auVar89 = ZEXT3264(auVar55);
                  auVar95 = ZEXT3264(auVar94);
                  auVar98 = ZEXT3264(auVar97);
                  auVar99 = ZEXT3264(auVar99._0_32_);
                  auVar102 = ZEXT3264(auVar102._0_32_);
                  auVar104 = ZEXT3264(auVar104._0_32_);
                  auVar105 = ZEXT3264(auVar105._0_32_);
                  auVar109 = ZEXT3264(auVar109._0_32_);
                  auVar114 = ZEXT3264(auVar114._0_32_);
                  auVar115 = ZEXT3264(local_26c0);
                  ray = local_2848;
                  pauVar38 = pauVar37;
                  iVar24 = 0;
                }
              }
            }
          }
        }
        else {
          iVar24 = 6;
        }
      } while (iVar24 == 0);
    } while (iVar24 != 6);
    lVar29 = (ulong)((uint)uVar40 & 0xf) - 8;
    if (lVar29 != 0) {
      uVar40 = uVar40 & 0xfffffffffffffff0;
      lVar35 = 0;
      local_27d8 = unaff_R12;
      do {
        lVar42 = lVar35 * 0x140;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar71._4_4_ = uVar25;
        auVar71._0_4_ = uVar25;
        auVar71._8_4_ = uVar25;
        auVar71._12_4_ = uVar25;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x90 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + lVar42));
        auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xa0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x10 + lVar42));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xb0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x20 + lVar42));
        auVar79 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xc0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x30 + lVar42));
        auVar68 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xd0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x40 + lVar42));
        auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xe0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x50 + lVar42));
        auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0xf0 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x60 + lVar42));
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x100 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x70 + lVar42));
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar40 + 0x110 + lVar42),auVar71,
                                  *(undefined1 (*) [16])(uVar40 + 0x80 + lVar42));
        uVar25 = *(undefined4 *)(ray + k * 4);
        auVar72._4_4_ = uVar25;
        auVar72._0_4_ = uVar25;
        auVar72._8_4_ = uVar25;
        auVar72._12_4_ = uVar25;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar107._4_4_ = uVar25;
        auVar107._0_4_ = uVar25;
        auVar107._8_4_ = uVar25;
        auVar107._12_4_ = uVar25;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar113._4_4_ = uVar25;
        auVar113._0_4_ = uVar25;
        auVar113._8_4_ = uVar25;
        auVar113._12_4_ = uVar25;
        auVar65 = vsubps_avx(auVar50,auVar72);
        local_2810 = vsubps_avx(auVar58,auVar107);
        local_27d0 = vsubps_avx(auVar51,auVar113);
        auVar50 = vsubps_avx(auVar79,auVar72);
        auVar58 = vsubps_avx(auVar68,auVar107);
        auVar51 = vsubps_avx(auVar53,auVar113);
        auVar79 = vsubps_avx(auVar73,auVar72);
        auVar68 = vsubps_avx(auVar75,auVar107);
        auVar53 = vsubps_avx(auVar43,auVar113);
        local_2610 = vsubps_avx(auVar79,auVar65);
        local_2630 = vsubps_avx(auVar68,local_2810);
        local_2620 = vsubps_avx(auVar53,local_27d0);
        auVar43._0_4_ = auVar79._0_4_ + auVar65._0_4_;
        auVar43._4_4_ = auVar79._4_4_ + auVar65._4_4_;
        auVar43._8_4_ = auVar79._8_4_ + auVar65._8_4_;
        auVar43._12_4_ = auVar79._12_4_ + auVar65._12_4_;
        auVar66._0_4_ = auVar68._0_4_ + local_2810._0_4_;
        auVar66._4_4_ = auVar68._4_4_ + local_2810._4_4_;
        auVar66._8_4_ = auVar68._8_4_ + local_2810._8_4_;
        auVar66._12_4_ = auVar68._12_4_ + local_2810._12_4_;
        fVar1 = local_27d0._0_4_;
        auVar73._0_4_ = auVar53._0_4_ + fVar1;
        fVar2 = local_27d0._4_4_;
        auVar73._4_4_ = auVar53._4_4_ + fVar2;
        fVar3 = local_27d0._8_4_;
        auVar73._8_4_ = auVar53._8_4_ + fVar3;
        fVar18 = local_27d0._12_4_;
        auVar73._12_4_ = auVar53._12_4_ + fVar18;
        auVar108._0_4_ = auVar66._0_4_ * local_2620._0_4_;
        auVar108._4_4_ = auVar66._4_4_ * local_2620._4_4_;
        auVar108._8_4_ = auVar66._8_4_ * local_2620._8_4_;
        auVar108._12_4_ = auVar66._12_4_ * local_2620._12_4_;
        auVar75 = vfmsub231ps_fma(auVar108,local_2630,auVar73);
        auVar74._0_4_ = auVar73._0_4_ * local_2610._0_4_;
        auVar74._4_4_ = auVar73._4_4_ * local_2610._4_4_;
        auVar74._8_4_ = auVar73._8_4_ * local_2610._8_4_;
        auVar74._12_4_ = auVar73._12_4_ * local_2610._12_4_;
        auVar73 = vfmsub231ps_fma(auVar74,local_2620,auVar43);
        auVar44._0_4_ = local_2630._0_4_ * auVar43._0_4_;
        auVar44._4_4_ = local_2630._4_4_ * auVar43._4_4_;
        auVar44._8_4_ = local_2630._8_4_ * auVar43._8_4_;
        auVar44._12_4_ = local_2630._12_4_ * auVar43._12_4_;
        auVar43 = vfmsub231ps_fma(auVar44,local_2610,auVar66);
        local_2820._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar96._0_4_ = local_2820._4_4_ * auVar43._0_4_;
        auVar96._4_4_ = local_2820._4_4_ * auVar43._4_4_;
        auVar96._8_4_ = local_2820._4_4_ * auVar43._8_4_;
        auVar96._12_4_ = local_2820._4_4_ * auVar43._12_4_;
        uVar25 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar103._4_4_ = uVar25;
        auVar103._0_4_ = uVar25;
        auVar103._8_4_ = uVar25;
        auVar103._12_4_ = uVar25;
        auVar73 = vfmadd231ps_fma(auVar96,auVar103,auVar73);
        uVar25 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_2830._4_4_ = uVar25;
        local_2830._0_4_ = uVar25;
        local_2830._8_4_ = uVar25;
        local_2830._12_4_ = uVar25;
        local_2660 = vfmadd231ps_fma(auVar73,local_2830,auVar75);
        local_2640 = vsubps_avx(local_2810,auVar58);
        local_2650 = vsubps_avx(local_27d0,auVar51);
        auVar67._0_4_ = local_2810._0_4_ + auVar58._0_4_;
        auVar67._4_4_ = local_2810._4_4_ + auVar58._4_4_;
        auVar67._8_4_ = local_2810._8_4_ + auVar58._8_4_;
        auVar67._12_4_ = local_2810._12_4_ + auVar58._12_4_;
        auVar75._0_4_ = fVar1 + auVar51._0_4_;
        auVar75._4_4_ = fVar2 + auVar51._4_4_;
        auVar75._8_4_ = fVar3 + auVar51._8_4_;
        auVar75._12_4_ = fVar18 + auVar51._12_4_;
        fVar10 = local_2650._0_4_;
        auVar83._0_4_ = auVar67._0_4_ * fVar10;
        fVar12 = local_2650._4_4_;
        auVar83._4_4_ = auVar67._4_4_ * fVar12;
        fVar14 = local_2650._8_4_;
        auVar83._8_4_ = auVar67._8_4_ * fVar14;
        fVar16 = local_2650._12_4_;
        auVar83._12_4_ = auVar67._12_4_ * fVar16;
        auVar43 = vfmsub231ps_fma(auVar83,local_2640,auVar75);
        auVar73 = vsubps_avx(auVar65,auVar50);
        fVar11 = auVar73._0_4_;
        auVar90._0_4_ = auVar75._0_4_ * fVar11;
        fVar13 = auVar73._4_4_;
        auVar90._4_4_ = auVar75._4_4_ * fVar13;
        fVar15 = auVar73._8_4_;
        auVar90._8_4_ = auVar75._8_4_ * fVar15;
        fVar17 = auVar73._12_4_;
        auVar90._12_4_ = auVar75._12_4_ * fVar17;
        auVar76._0_4_ = auVar65._0_4_ + auVar50._0_4_;
        auVar76._4_4_ = auVar65._4_4_ + auVar50._4_4_;
        auVar76._8_4_ = auVar65._8_4_ + auVar50._8_4_;
        auVar76._12_4_ = auVar65._12_4_ + auVar50._12_4_;
        auVar75 = vfmsub231ps_fma(auVar90,local_2650,auVar76);
        fVar106 = local_2640._0_4_;
        auVar77._0_4_ = fVar106 * auVar76._0_4_;
        fVar110 = local_2640._4_4_;
        auVar77._4_4_ = fVar110 * auVar76._4_4_;
        fVar111 = local_2640._8_4_;
        auVar77._8_4_ = fVar111 * auVar76._8_4_;
        fVar112 = local_2640._12_4_;
        auVar77._12_4_ = fVar112 * auVar76._12_4_;
        auVar44 = vfmsub231ps_fma(auVar77,auVar73,auVar67);
        auVar78._0_4_ = local_2820._4_4_ * auVar44._0_4_;
        auVar78._4_4_ = local_2820._4_4_ * auVar44._4_4_;
        auVar78._8_4_ = local_2820._4_4_ * auVar44._8_4_;
        auVar78._12_4_ = local_2820._4_4_ * auVar44._12_4_;
        auVar75 = vfmadd231ps_fma(auVar78,auVar103,auVar75);
        local_2760 = vfmadd231ps_fma(auVar75,local_2830,auVar43);
        auVar75 = vsubps_avx(auVar50,auVar79);
        auVar59._0_4_ = auVar50._0_4_ + auVar79._0_4_;
        auVar59._4_4_ = auVar50._4_4_ + auVar79._4_4_;
        auVar59._8_4_ = auVar50._8_4_ + auVar79._8_4_;
        auVar59._12_4_ = auVar50._12_4_ + auVar79._12_4_;
        auVar79 = vsubps_avx(auVar58,auVar68);
        auVar52._0_4_ = auVar58._0_4_ + auVar68._0_4_;
        auVar52._4_4_ = auVar58._4_4_ + auVar68._4_4_;
        auVar52._8_4_ = auVar58._8_4_ + auVar68._8_4_;
        auVar52._12_4_ = auVar58._12_4_ + auVar68._12_4_;
        auVar68 = vsubps_avx(auVar51,auVar53);
        auVar80._0_4_ = auVar51._0_4_ + auVar53._0_4_;
        auVar80._4_4_ = auVar51._4_4_ + auVar53._4_4_;
        auVar80._8_4_ = auVar51._8_4_ + auVar53._8_4_;
        auVar80._12_4_ = auVar51._12_4_ + auVar53._12_4_;
        auVar84._0_4_ = auVar68._0_4_ * auVar52._0_4_;
        auVar84._4_4_ = auVar68._4_4_ * auVar52._4_4_;
        auVar84._8_4_ = auVar68._8_4_ * auVar52._8_4_;
        auVar84._12_4_ = auVar68._12_4_ * auVar52._12_4_;
        auVar58 = vfmsub231ps_fma(auVar84,auVar79,auVar80);
        auVar81._0_4_ = auVar80._0_4_ * auVar75._0_4_;
        auVar81._4_4_ = auVar80._4_4_ * auVar75._4_4_;
        auVar81._8_4_ = auVar80._8_4_ * auVar75._8_4_;
        auVar81._12_4_ = auVar80._12_4_ * auVar75._12_4_;
        auVar50 = vfmsub231ps_fma(auVar81,auVar68,auVar59);
        auVar60._0_4_ = auVar79._0_4_ * auVar59._0_4_;
        auVar60._4_4_ = auVar79._4_4_ * auVar59._4_4_;
        auVar60._8_4_ = auVar79._8_4_ * auVar59._8_4_;
        auVar60._12_4_ = auVar79._12_4_ * auVar59._12_4_;
        auVar51 = vfmsub231ps_fma(auVar60,auVar75,auVar52);
        local_2820._0_4_ = local_2820._4_4_;
        fStack_2818 = local_2820._4_4_;
        fStack_2814 = local_2820._4_4_;
        auVar61._0_4_ = local_2820._4_4_ * auVar51._0_4_;
        auVar61._4_4_ = local_2820._4_4_ * auVar51._4_4_;
        auVar61._8_4_ = local_2820._4_4_ * auVar51._8_4_;
        auVar61._12_4_ = local_2820._4_4_ * auVar51._12_4_;
        auVar50 = vfmadd231ps_fma(auVar61,auVar103,auVar50);
        auVar51 = vfmadd231ps_fma(auVar50,local_2830,auVar58);
        local_2770 = local_2660._0_4_;
        fStack_276c = local_2660._4_4_;
        fStack_2768 = local_2660._8_4_;
        fStack_2764 = local_2660._12_4_;
        local_2750._0_4_ = auVar51._0_4_ + local_2770 + local_2760._0_4_;
        local_2750._4_4_ = auVar51._4_4_ + fStack_276c + local_2760._4_4_;
        local_2750._8_4_ = auVar51._8_4_ + fStack_2768 + local_2760._8_4_;
        local_2750._12_4_ = auVar51._12_4_ + fStack_2764 + local_2760._12_4_;
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        auVar50 = vminps_avx(local_2660,local_2760);
        auVar50 = vminps_avx(auVar50,auVar51);
        local_2670 = vandps_avx(local_2750,auVar53);
        auVar91._0_4_ = local_2670._0_4_ * 1.1920929e-07;
        auVar91._4_4_ = local_2670._4_4_ * 1.1920929e-07;
        auVar91._8_4_ = local_2670._8_4_ * 1.1920929e-07;
        auVar91._12_4_ = local_2670._12_4_ * 1.1920929e-07;
        uVar27 = CONCAT44(auVar91._4_4_,auVar91._0_4_);
        auVar85._0_8_ = uVar27 ^ 0x8000000080000000;
        auVar85._8_4_ = -auVar91._8_4_;
        auVar85._12_4_ = -auVar91._12_4_;
        auVar50 = vcmpps_avx(auVar50,auVar85,5);
        auVar58 = vmaxps_avx(local_2660,local_2760);
        auVar58 = vmaxps_avx(auVar58,auVar51);
        auVar58 = vcmpps_avx(auVar58,auVar91,2);
        auVar50 = vorps_avx(auVar50,auVar58);
        if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar50[0xf] < '\0') {
          auVar62._0_4_ = local_2620._0_4_ * fVar106;
          auVar62._4_4_ = local_2620._4_4_ * fVar110;
          auVar62._8_4_ = local_2620._8_4_ * fVar111;
          auVar62._12_4_ = local_2620._12_4_ * fVar112;
          auVar86._0_4_ = fVar11 * local_2630._0_4_;
          auVar86._4_4_ = fVar13 * local_2630._4_4_;
          auVar86._8_4_ = fVar15 * local_2630._8_4_;
          auVar86._12_4_ = fVar17 * local_2630._12_4_;
          auVar43 = vfmsub213ps_fma(local_2630,local_2650,auVar62);
          auVar82._0_4_ = auVar79._0_4_ * fVar10;
          auVar82._4_4_ = auVar79._4_4_ * fVar12;
          auVar82._8_4_ = auVar79._8_4_ * fVar14;
          auVar82._12_4_ = auVar79._12_4_ * fVar16;
          auVar92._0_4_ = fVar11 * auVar68._0_4_;
          auVar92._4_4_ = fVar13 * auVar68._4_4_;
          auVar92._8_4_ = fVar15 * auVar68._8_4_;
          auVar92._12_4_ = fVar17 * auVar68._12_4_;
          auVar68 = vfmsub213ps_fma(auVar68,local_2640,auVar82);
          auVar58 = vandps_avx(auVar62,auVar53);
          auVar51 = vandps_avx(auVar82,auVar53);
          auVar58 = vcmpps_avx(auVar58,auVar51,1);
          local_26f0 = vblendvps_avx(auVar68,auVar43,auVar58);
          auVar100._0_4_ = auVar75._0_4_ * fVar106;
          auVar100._4_4_ = auVar75._4_4_ * fVar110;
          auVar100._8_4_ = auVar75._8_4_ * fVar111;
          auVar100._12_4_ = auVar75._12_4_ * fVar112;
          auVar68 = vfmsub213ps_fma(auVar75,local_2650,auVar92);
          auVar63._0_4_ = local_2610._0_4_ * fVar10;
          auVar63._4_4_ = local_2610._4_4_ * fVar12;
          auVar63._8_4_ = local_2610._8_4_ * fVar14;
          auVar63._12_4_ = local_2610._12_4_ * fVar16;
          auVar75 = vfmsub213ps_fma(local_2620,auVar73,auVar63);
          auVar58 = vandps_avx(auVar63,auVar53);
          auVar51 = vandps_avx(auVar92,auVar53);
          auVar58 = vcmpps_avx(auVar58,auVar51,1);
          local_26e0 = vblendvps_avx(auVar68,auVar75,auVar58);
          auVar68 = vfmsub213ps_fma(local_2610,local_2640,auVar86);
          auVar79 = vfmsub213ps_fma(auVar79,auVar73,auVar100);
          auVar58 = vandps_avx(auVar86,auVar53);
          auVar51 = vandps_avx(auVar100,auVar53);
          auVar58 = vcmpps_avx(auVar58,auVar51,1);
          local_26d0 = vblendvps_avx(auVar79,auVar68,auVar58);
          auVar68._0_4_ = local_26d0._0_4_ * local_2820._4_4_;
          auVar68._4_4_ = local_26d0._4_4_ * local_2820._4_4_;
          auVar68._8_4_ = local_26d0._8_4_ * local_2820._4_4_;
          auVar68._12_4_ = local_26d0._12_4_ * local_2820._4_4_;
          auVar58 = vfmadd213ps_fma(auVar103,local_26e0,auVar68);
          auVar58 = vfmadd213ps_fma(local_2830,local_26f0,auVar58);
          auVar69._0_4_ = auVar58._0_4_ + auVar58._0_4_;
          auVar69._4_4_ = auVar58._4_4_ + auVar58._4_4_;
          auVar69._8_4_ = auVar58._8_4_ + auVar58._8_4_;
          auVar69._12_4_ = auVar58._12_4_ + auVar58._12_4_;
          auVar87._0_4_ = local_26d0._0_4_ * fVar1;
          auVar87._4_4_ = local_26d0._4_4_ * fVar2;
          auVar87._8_4_ = local_26d0._8_4_ * fVar3;
          auVar87._12_4_ = local_26d0._12_4_ * fVar18;
          auVar58 = vfmadd213ps_fma(local_2810,local_26e0,auVar87);
          auVar65 = vfmadd213ps_fma(auVar65,local_26f0,auVar58);
          auVar58 = vrcpps_avx(auVar69);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = &DAT_3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar51 = vfnmadd213ps_fma(auVar58,auVar69,auVar101);
          auVar58 = vfmadd132ps_fma(auVar51,auVar58,auVar58);
          local_2700._0_4_ = auVar58._0_4_ * (auVar65._0_4_ + auVar65._0_4_);
          local_2700._4_4_ = auVar58._4_4_ * (auVar65._4_4_ + auVar65._4_4_);
          local_2700._8_4_ = auVar58._8_4_ * (auVar65._8_4_ + auVar65._8_4_);
          local_2700._12_4_ = auVar58._12_4_ * (auVar65._12_4_ + auVar65._12_4_);
          auVar49 = ZEXT1664(local_2700);
          uVar25 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar88._4_4_ = uVar25;
          auVar88._0_4_ = uVar25;
          auVar88._8_4_ = uVar25;
          auVar88._12_4_ = uVar25;
          auVar58 = vcmpps_avx(auVar88,local_2700,2);
          uVar25 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar93._4_4_ = uVar25;
          auVar93._0_4_ = uVar25;
          auVar93._8_4_ = uVar25;
          auVar93._12_4_ = uVar25;
          auVar65 = vcmpps_avx(local_2700,auVar93,2);
          auVar58 = vandps_avx(auVar58,auVar65);
          auVar51 = auVar50 & auVar58;
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar50 = vandps_avx(auVar50,auVar58);
            auVar58 = vcmpps_avx(auVar69,_DAT_01feba10,4);
            auVar51 = auVar58 & auVar50;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') {
              local_27f0 = vandps_avx(auVar50,auVar58);
              local_2740 = &local_2859;
              pSVar30 = context->scene;
              auVar50 = vrcpps_avx(local_2750);
              auVar70._8_4_ = 0x3f800000;
              auVar70._0_8_ = &DAT_3f8000003f800000;
              auVar70._12_4_ = 0x3f800000;
              auVar58 = vfnmadd213ps_fma(local_2750,auVar50,auVar70);
              auVar58 = vfmadd132ps_fma(auVar58,auVar50,auVar50);
              auVar64._8_4_ = 0x219392ef;
              auVar64._0_8_ = 0x219392ef219392ef;
              auVar64._12_4_ = 0x219392ef;
              auVar50 = vcmpps_avx(local_2670,auVar64,5);
              auVar50 = vandps_avx(auVar58,auVar50);
              auVar45._0_4_ = local_2770 * auVar50._0_4_;
              auVar45._4_4_ = fStack_276c * auVar50._4_4_;
              auVar45._8_4_ = fStack_2768 * auVar50._8_4_;
              auVar45._12_4_ = fStack_2764 * auVar50._12_4_;
              local_2720 = vminps_avx(auVar45,auVar70);
              auVar46._0_4_ = auVar50._0_4_ * local_2760._0_4_;
              auVar46._4_4_ = auVar50._4_4_ * local_2760._4_4_;
              auVar46._8_4_ = auVar50._8_4_ * local_2760._8_4_;
              auVar46._12_4_ = auVar50._12_4_ * local_2760._12_4_;
              local_2710 = vminps_avx(auVar46,auVar70);
              auVar47._8_4_ = 0x7f800000;
              auVar47._0_8_ = 0x7f8000007f800000;
              auVar47._12_4_ = 0x7f800000;
              auVar50 = vblendvps_avx(auVar47,local_2700,local_27f0);
              auVar58 = vshufps_avx(auVar50,auVar50,0xb1);
              auVar58 = vminps_avx(auVar58,auVar50);
              auVar51 = vshufpd_avx(auVar58,auVar58,1);
              auVar58 = vminps_avx(auVar51,auVar58);
              auVar58 = vcmpps_avx(auVar50,auVar58,0);
              auVar51 = local_27f0 & auVar58;
              auVar50 = local_27f0;
              if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar51[0xf] < '\0') {
                auVar50 = vandps_avx(auVar58,local_27f0);
              }
              lVar42 = lVar42 + uVar40;
              uVar25 = vmovmskps_avx(auVar50);
              lVar39 = 0;
              for (uVar27 = CONCAT44((int)((ulong)local_2740 >> 0x20),uVar25); (uVar27 & 1) == 0;
                  uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              auVar55 = vpcmpeqd_avx2(ZEXT1632(auVar65),ZEXT1632(auVar65));
              auVar89 = ZEXT3264(auVar55);
              uStack_2838 = auVar103._8_8_;
              local_2840 = pSVar30;
              local_2730 = local_27f0;
              do {
                uVar6 = *(uint *)(lVar42 + 0x120 + lVar39 * 4);
                pRVar28 = (RayHitK<8> *)(ulong)uVar6;
                pGVar8 = (pSVar30->geometries).items[(long)pRVar28].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_27f0 + lVar39 * 4) = 0;
                  pSVar30 = local_2840;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar25 = *(undefined4 *)(local_2720 + lVar39 * 4);
                    uVar4 = *(undefined4 *)(local_2710 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26f0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26e0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26d0 + lVar39 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar25;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)(lVar42 + 0x130 + lVar39 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    unaff_R12 = local_27d8;
                    break;
                  }
                  local_2460 = *(undefined4 *)(local_2720 + lVar39 * 4);
                  local_2440 = *(undefined4 *)(local_2710 + lVar39 * 4);
                  local_2420 = *(undefined4 *)(lVar42 + 0x130 + lVar39 * 4);
                  uVar25 = *(undefined4 *)(local_26f0 + lVar39 * 4);
                  local_24c0._4_4_ = uVar25;
                  local_24c0._0_4_ = uVar25;
                  local_24c0._8_4_ = uVar25;
                  local_24c0._12_4_ = uVar25;
                  local_24c0._16_4_ = uVar25;
                  local_24c0._20_4_ = uVar25;
                  local_24c0._24_4_ = uVar25;
                  local_24c0._28_4_ = uVar25;
                  uVar25 = *(undefined4 *)(local_26e0 + lVar39 * 4);
                  local_24a0._4_4_ = uVar25;
                  local_24a0._0_4_ = uVar25;
                  local_24a0._8_4_ = uVar25;
                  local_24a0._12_4_ = uVar25;
                  local_24a0._16_4_ = uVar25;
                  local_24a0._20_4_ = uVar25;
                  local_24a0._24_4_ = uVar25;
                  local_24a0._28_4_ = uVar25;
                  uVar25 = *(undefined4 *)(local_26d0 + lVar39 * 4);
                  local_2480._4_4_ = uVar25;
                  local_2480._0_4_ = uVar25;
                  local_2480._8_4_ = uVar25;
                  local_2480._12_4_ = uVar25;
                  local_2480._16_4_ = uVar25;
                  local_2480._20_4_ = uVar25;
                  local_2480._24_4_ = uVar25;
                  local_2480._28_4_ = uVar25;
                  local_2400._4_4_ = uVar6;
                  local_2400._0_4_ = uVar6;
                  local_2400._8_4_ = uVar6;
                  local_2400._12_4_ = uVar6;
                  local_2400._16_4_ = uVar6;
                  local_2400._20_4_ = uVar6;
                  local_2400._24_4_ = uVar6;
                  local_2400._28_4_ = uVar6;
                  uStack_245c = local_2460;
                  uStack_2458 = local_2460;
                  uStack_2454 = local_2460;
                  uStack_2450 = local_2460;
                  uStack_244c = local_2460;
                  uStack_2448 = local_2460;
                  uStack_2444 = local_2460;
                  uStack_243c = local_2440;
                  uStack_2438 = local_2440;
                  uStack_2434 = local_2440;
                  uStack_2430 = local_2440;
                  uStack_242c = local_2440;
                  uStack_2428 = local_2440;
                  uStack_2424 = local_2440;
                  uStack_241c = local_2420;
                  uStack_2418 = local_2420;
                  uStack_2414 = local_2420;
                  uStack_2410 = local_2420;
                  uStack_240c = local_2420;
                  uStack_2408 = local_2420;
                  uStack_2404 = local_2420;
                  uStack_23dc = context->user->instID[0];
                  local_23e0 = uStack_23dc;
                  uStack_23d8 = uStack_23dc;
                  uStack_23d4 = uStack_23dc;
                  uStack_23d0 = uStack_23dc;
                  uStack_23cc = uStack_23dc;
                  uStack_23c8 = uStack_23dc;
                  uStack_23c4 = uStack_23dc;
                  uStack_23bc = context->user->instPrimID[0];
                  local_23c0 = uStack_23bc;
                  uStack_23b8 = uStack_23bc;
                  uStack_23b4 = uStack_23bc;
                  uStack_23b0 = uStack_23bc;
                  uStack_23ac = uStack_23bc;
                  uStack_23a8 = uStack_23bc;
                  uStack_23a4 = uStack_23bc;
                  uVar25 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + lVar39 * 4);
                  local_26a0 = local_2600._0_8_;
                  uStack_2698 = local_2600._8_8_;
                  uStack_2690 = local_2600._16_8_;
                  uStack_2688 = local_2600._24_8_;
                  local_27a0 = &local_26a0;
                  local_2798 = pGVar8->userPtr;
                  local_2790 = context->user;
                  local_2780 = &local_24c0;
                  local_2778 = 8;
                  pRVar28 = (RayHitK<8> *)pGVar8->intersectionFilterN;
                  local_2788 = ray;
                  if (pRVar28 != (RayHitK<8> *)0x0) {
                    local_2830._0_8_ = lVar35;
                    local_27d0._0_8_ = pauVar38;
                    local_2820 = lVar29;
                    local_2800 = auVar49._0_16_;
                    local_2810._0_4_ = uVar25;
                    auVar55 = ZEXT1632(auVar89._0_16_);
                    pRVar28 = (RayHitK<8> *)(*(code *)pRVar28)(&local_27a0);
                    auVar49 = ZEXT1664(local_2800);
                    auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                    auVar89 = ZEXT3264(auVar55);
                    lVar29 = local_2820;
                    uVar31 = local_2850;
                    lVar35 = local_2830._0_8_;
                    uVar36 = local_2858;
                    ray = local_2848;
                    pauVar38 = (undefined1 (*) [16])local_27d0._0_8_;
                    uVar25 = local_2810._0_4_;
                  }
                  auVar94._8_8_ = uStack_2698;
                  auVar94._0_8_ = local_26a0;
                  auVar94._16_8_ = uStack_2690;
                  auVar94._24_8_ = uStack_2688;
                  auVar94 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar94);
                  auVar55 = auVar89._0_32_ & ~auVar94;
                  if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar55 >> 0x7f,0) == '\0') &&
                        (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar55 >> 0xbf,0) == '\0') &&
                      (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar55[0x1f]) {
                    auVar94 = auVar94 ^ auVar89._0_32_;
                  }
                  else {
                    pRVar28 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar28 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      local_2830._0_8_ = lVar35;
                      local_2820 = lVar29;
                      local_2800 = auVar49._0_16_;
                      local_2810._0_4_ = uVar25;
                      auVar55 = ZEXT1632(auVar89._0_16_);
                      pRVar28 = (RayHitK<8> *)(*(code *)pRVar28)(&local_27a0);
                      auVar49 = ZEXT1664(local_2800);
                      auVar55 = vpcmpeqd_avx2(auVar55,auVar55);
                      auVar89 = ZEXT3264(auVar55);
                      lVar29 = local_2820;
                      uVar31 = local_2850;
                      lVar35 = local_2830._0_8_;
                      uVar36 = local_2858;
                      ray = local_2848;
                      uVar25 = local_2810._0_4_;
                    }
                    auVar97._8_8_ = uStack_2698;
                    auVar97._0_8_ = local_26a0;
                    auVar97._16_8_ = uStack_2690;
                    auVar97._24_8_ = uStack_2688;
                    auVar97 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar97);
                    auVar94 = auVar97 ^ auVar89._0_32_;
                    auVar55 = auVar89._0_32_ & ~auVar97;
                    if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar55 >> 0x7f,0) != '\0') ||
                          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar55 >> 0xbf,0) != '\0') ||
                        (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar55[0x1f] < '\0') {
                      auVar57._0_4_ = auVar97._0_4_ ^ auVar89._0_4_;
                      auVar57._4_4_ = auVar97._4_4_ ^ auVar89._4_4_;
                      auVar57._8_4_ = auVar97._8_4_ ^ auVar89._8_4_;
                      auVar57._12_4_ = auVar97._12_4_ ^ auVar89._12_4_;
                      auVar57._16_4_ = auVar97._16_4_ ^ auVar89._16_4_;
                      auVar57._20_4_ = auVar97._20_4_ ^ auVar89._20_4_;
                      auVar57._24_4_ = auVar97._24_4_ ^ auVar89._24_4_;
                      auVar57._28_4_ = auVar97._28_4_ ^ auVar89._28_4_;
                      auVar55 = vmaskmovps_avx(auVar57,*local_2780);
                      *(undefined1 (*) [32])(local_2788 + 0x180) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar57,local_2780[1]);
                      *(undefined1 (*) [32])(local_2788 + 0x1a0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar57,local_2780[2]);
                      *(undefined1 (*) [32])(local_2788 + 0x1c0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar57,local_2780[3]);
                      *(undefined1 (*) [32])(local_2788 + 0x1e0) = auVar55;
                      auVar55 = vmaskmovps_avx(auVar57,local_2780[4]);
                      *(undefined1 (*) [32])(local_2788 + 0x200) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar57,local_2780[5]);
                      *(undefined1 (*) [32])(local_2788 + 0x220) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar57,local_2780[6]);
                      *(undefined1 (*) [32])(local_2788 + 0x240) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar57,local_2780[7]);
                      *(undefined1 (*) [32])(local_2788 + 0x260) = auVar55;
                      auVar55 = vpmaskmovd_avx2(auVar57,local_2780[8]);
                      *(undefined1 (*) [32])(local_2788 + 0x280) = auVar55;
                      pRVar28 = local_2788;
                    }
                  }
                  if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar94 >> 0x7f,0) == '\0') &&
                        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar94 >> 0xbf,0) == '\0') &&
                      (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar94[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar25;
                  }
                  *(undefined4 *)(local_27f0 + lVar39 * 4) = 0;
                  uVar25 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar48._4_4_ = uVar25;
                  auVar48._0_4_ = uVar25;
                  auVar48._8_4_ = uVar25;
                  auVar48._12_4_ = uVar25;
                  auVar50 = vcmpps_avx(auVar49._0_16_,auVar48,2);
                  local_27f0 = vandps_avx(auVar50,local_27f0);
                  pSVar30 = local_2840;
                }
                unaff_R12 = local_27d8;
                if ((((local_27f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_27f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_27f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_27f0[0xf]) break;
                auVar54._8_4_ = 0x7f800000;
                auVar54._0_8_ = 0x7f8000007f800000;
                auVar54._12_4_ = 0x7f800000;
                auVar50 = vblendvps_avx(auVar54,auVar49._0_16_,local_27f0);
                auVar58 = vshufps_avx(auVar50,auVar50,0xb1);
                auVar58 = vminps_avx(auVar58,auVar50);
                auVar65 = vshufpd_avx(auVar58,auVar58,1);
                auVar58 = vminps_avx(auVar65,auVar58);
                auVar58 = vcmpps_avx(auVar50,auVar58,0);
                auVar65 = local_27f0 & auVar58;
                auVar50 = local_27f0;
                if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar65[0xf] < '\0') {
                  auVar50 = vandps_avx(auVar58,local_27f0);
                }
                uVar25 = vmovmskps_avx(auVar50);
                lVar39 = 0;
                for (uVar27 = CONCAT44((int)((ulong)pRVar28 >> 0x20),uVar25); (uVar27 & 1) == 0;
                    uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                  lVar39 = lVar39 + 1;
                }
              } while( true );
            }
          }
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != lVar29);
    }
    uVar25 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar49 = ZEXT3264(CONCAT428(uVar25,CONCAT424(uVar25,CONCAT420(uVar25,CONCAT416(uVar25,CONCAT412
                                                  (uVar25,CONCAT48(uVar25,CONCAT44(uVar25,uVar25))))
                                                  ))));
    auVar89 = ZEXT3264(local_24e0);
    auVar95 = ZEXT3264(local_2500);
    auVar98 = ZEXT3264(local_2520);
    auVar99 = ZEXT3264(local_2540);
    auVar102 = ZEXT3264(local_2560);
    auVar104 = ZEXT3264(local_2580);
    auVar105 = ZEXT3264(local_25a0);
    auVar109 = ZEXT3264(local_25c0);
    auVar114 = ZEXT3264(local_25e0);
    auVar115 = ZEXT3264(local_26c0);
    uVar27 = local_27b8;
    uVar41 = local_27c0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }